

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16781328,_false,_embree::avx512::VirtualCurveIntersectorK<8>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  byte bVar1;
  BVH *bvh;
  ulong uVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined8 uVar18;
  ulong uVar19;
  ulong uVar20;
  size_t k;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  byte bVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  char cVar37;
  byte bVar38;
  byte bVar39;
  size_t mask;
  ulong uVar40;
  uint uVar41;
  undefined4 uVar42;
  long lVar43;
  uint uVar44;
  ulong *puVar45;
  NodeRef root;
  undefined1 (*pauVar46) [32];
  bool bVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  int iVar74;
  undefined1 auVar53 [16];
  int iVar51;
  undefined1 auVar54 [16];
  int iVar72;
  int iVar73;
  int iVar75;
  int iVar76;
  int iVar77;
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar52 [16];
  undefined1 auVar57 [32];
  int iVar78;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 in_ZMM4 [64];
  float fVar84;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar85 [16];
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  vfloat4 a0;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 in_ZMM28 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  TravRayK<8,_false> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_29e0;
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  uint local_2840;
  uint uStack_283c;
  uint uStack_2838;
  uint uStack_2834;
  uint uStack_2830;
  uint uStack_282c;
  uint uStack_2828;
  uint uStack_2824;
  uint local_2820;
  uint uStack_281c;
  uint uStack_2818;
  uint uStack_2814;
  uint uStack_2810;
  uint uStack_280c;
  uint uStack_2808;
  uint uStack_2804;
  uint local_2800;
  uint uStack_27fc;
  uint uStack_27f8;
  uint uStack_27f4;
  uint uStack_27f0;
  uint uStack_27ec;
  uint uStack_27e8;
  uint uStack_27e4;
  undefined1 local_27e0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_27c0;
  undefined1 local_27a0 [16];
  undefined1 auStack_2790 [16];
  undefined1 auStack_2780 [368];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  uint local_1e60;
  uint uStack_1e5c;
  uint uStack_1e58;
  uint uStack_1e54;
  uint uStack_1e50;
  uint uStack_1e4c;
  uint uStack_1e48;
  uint uStack_1e44;
  undefined1 local_1e40 [7696];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar59 = *(undefined1 (*) [32])(ray + 0x100);
    auVar56 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    uVar48 = vcmpps_avx512vl(auVar59,ZEXT1632(ZEXT816(0) << 0x40),5);
    uVar40 = vpcmpeqd_avx512vl(auVar56,(undefined1  [32])valid_i->field_0);
    uVar48 = uVar48 & uVar40;
    bVar39 = (byte)uVar48;
    if (bVar39 != 0) {
      local_2980 = *(undefined1 (*) [32])(ray + 0x80);
      local_2960 = *(undefined1 (*) [32])(ray + 0xa0);
      local_2940 = *(undefined1 (*) [32])(ray + 0xc0);
      fVar11 = local_2940._0_4_;
      auVar109._0_4_ = fVar11 * fVar11;
      fVar12 = local_2940._4_4_;
      auVar109._4_4_ = fVar12 * fVar12;
      fVar13 = local_2940._8_4_;
      auVar109._8_4_ = fVar13 * fVar13;
      fVar14 = local_2940._12_4_;
      auVar109._12_4_ = fVar14 * fVar14;
      fVar15 = local_2940._16_4_;
      auVar109._16_4_ = fVar15 * fVar15;
      fVar16 = local_2940._20_4_;
      auVar109._20_4_ = fVar16 * fVar16;
      fVar17 = local_2940._24_4_;
      auVar109._28_36_ = in_ZMM4._28_36_;
      auVar109._24_4_ = fVar17 * fVar17;
      auVar54 = vfmadd231ps_fma(auVar109._0_32_,local_2960,local_2960);
      auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),local_2980,local_2980);
      auVar55 = vrsqrt14ps_avx512vl(ZEXT1632(auVar54));
      auVar56._8_4_ = 0xbf000000;
      auVar56._0_8_ = 0xbf000000bf000000;
      auVar56._12_4_ = 0xbf000000;
      auVar56._16_4_ = 0xbf000000;
      auVar56._20_4_ = 0xbf000000;
      auVar56._24_4_ = 0xbf000000;
      auVar56._28_4_ = 0xbf000000;
      auVar56 = vmulps_avx512vl(ZEXT1632(auVar54),auVar56);
      fVar84 = auVar55._0_4_;
      fVar88 = auVar55._4_4_;
      fVar89 = auVar55._8_4_;
      fVar90 = auVar55._12_4_;
      fVar91 = auVar55._16_4_;
      fVar92 = auVar55._20_4_;
      fVar93 = auVar55._24_4_;
      auVar54._0_4_ = fVar84 * fVar84;
      auVar54._4_4_ = fVar88 * fVar88;
      auVar54._8_4_ = fVar89 * fVar89;
      auVar54._12_4_ = fVar90 * fVar90;
      auVar58._4_4_ = auVar54._4_4_ * fVar88 * auVar56._4_4_;
      auVar58._0_4_ = auVar54._0_4_ * fVar84 * auVar56._0_4_;
      auVar58._8_4_ = auVar54._8_4_ * fVar89 * auVar56._8_4_;
      auVar58._12_4_ = auVar54._12_4_ * fVar90 * auVar56._12_4_;
      auVar58._16_4_ = fVar91 * fVar91 * fVar91 * auVar56._16_4_;
      auVar58._20_4_ = fVar92 * fVar92 * fVar92 * auVar56._20_4_;
      auVar58._24_4_ = fVar93 * fVar93 * fVar93 * auVar56._24_4_;
      auVar58._28_4_ = auVar56._28_4_;
      auVar57._8_4_ = 0x3fc00000;
      auVar57._0_8_ = 0x3fc000003fc00000;
      auVar57._12_4_ = 0x3fc00000;
      auVar57._16_4_ = 0x3fc00000;
      auVar57._20_4_ = 0x3fc00000;
      auVar57._24_4_ = 0x3fc00000;
      auVar57._28_4_ = 0x3fc00000;
      local_27c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                   vfmadd231ps_avx512vl(auVar58,auVar55,auVar57);
      auVar81._8_4_ = 0x80000000;
      auVar81._0_8_ = 0x8000000080000000;
      auVar81._12_4_ = 0x80000000;
      auVar85._12_4_ = 0;
      auVar85._0_12_ = ZEXT812(0);
      auVar85 = auVar85 << 0x20;
      auVar54 = vpcmpeqd_avx(auVar54,auVar54);
      uVar40 = uVar48;
      do {
        lVar43 = 0;
        for (uVar50 = uVar40; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
          lVar43 = lVar43 + 1;
        }
        uVar50 = (ulong)(uint)((int)lVar43 * 4);
        auVar53 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar50 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar50 + 0xa0)),0x1c);
        fVar84 = *(float *)((long)&local_27c0 + uVar50);
        auVar53 = vinsertps_avx(auVar53,ZEXT416(*(uint *)(ray + uVar50 + 0xc0)),0x28);
        auVar99._0_4_ = auVar53._0_4_ * fVar84;
        auVar99._4_4_ = auVar53._4_4_ * fVar84;
        auVar99._8_4_ = auVar53._8_4_ * fVar84;
        auVar99._12_4_ = auVar53._12_4_ * fVar84;
        auVar53 = vshufpd_avx(auVar99,auVar99,1);
        auVar100 = vmovshdup_avx(auVar99);
        auVar102 = vunpckhps_avx(auVar99,auVar85);
        auVar52._0_8_ = auVar53._0_8_ ^ 0x8000000080000000;
        auVar52._8_8_ = auVar53._8_8_ ^ auVar81._8_8_;
        auVar52 = vinsertps_avx(auVar52,auVar99,0x2a);
        auVar53 = vdpps_avx(auVar52,auVar52,0x7f);
        auVar102 = vshufps_avx(auVar102,ZEXT416(auVar100._0_4_ ^ 0x80000000),0x41);
        auVar100 = vdpps_avx(auVar102,auVar102,0x7f);
        uVar18 = vcmpps_avx512vl(auVar53,auVar100,1);
        auVar53 = vpmovm2d_avx512vl(uVar18);
        auVar106._0_4_ = auVar53._0_4_;
        auVar106._4_4_ = auVar106._0_4_;
        auVar106._8_4_ = auVar106._0_4_;
        auVar106._12_4_ = auVar106._0_4_;
        uVar50 = vpmovd2m_avx512vl(auVar106);
        auVar53._4_4_ = (uint)((byte)(uVar50 >> 1) & 1) * auVar54._4_4_;
        auVar53._0_4_ = (uint)((byte)uVar50 & 1) * auVar54._0_4_;
        auVar53._8_4_ = (uint)((byte)(uVar50 >> 2) & 1) * auVar54._8_4_;
        auVar53._12_4_ = (uint)((byte)(uVar50 >> 3) & 1) * auVar54._12_4_;
        auVar53 = vblendvps_avx(auVar52,auVar102,auVar53);
        auVar100 = vdpps_avx(auVar53,auVar53,0x7f);
        auVar52 = vrsqrt14ss_avx512f(auVar85,ZEXT416((uint)auVar100._0_4_));
        fVar88 = auVar52._0_4_;
        fVar88 = fVar88 * 1.5 - auVar100._0_4_ * 0.5 * fVar88 * fVar88 * fVar88;
        auVar102._0_4_ = auVar53._0_4_ * fVar88;
        auVar102._4_4_ = auVar53._4_4_ * fVar88;
        auVar102._8_4_ = auVar53._8_4_ * fVar88;
        auVar102._12_4_ = auVar53._12_4_ * fVar88;
        auVar53 = vshufps_avx(auVar102,auVar102,0xc9);
        auVar100 = vshufps_avx(auVar99,auVar99,0xc9);
        auVar107._0_4_ = auVar102._0_4_ * auVar100._0_4_;
        auVar107._4_4_ = auVar102._4_4_ * auVar100._4_4_;
        auVar107._8_4_ = auVar102._8_4_ * auVar100._8_4_;
        auVar107._12_4_ = auVar102._12_4_ * auVar100._12_4_;
        auVar53 = vfmsub231ps_fma(auVar107,auVar99,auVar53);
        lVar43 = lVar43 * 0x30;
        auVar100 = vshufps_avx(auVar53,auVar53,0xc9);
        auVar53 = vdpps_avx(auVar100,auVar100,0x7f);
        uVar40 = uVar40 - 1 & uVar40;
        auVar52 = vrsqrt14ss_avx512f(auVar85,ZEXT416((uint)auVar53._0_4_));
        fVar88 = auVar52._0_4_;
        fVar88 = fVar88 * 1.5 - auVar53._0_4_ * 0.5 * fVar88 * fVar88 * fVar88;
        auVar104._0_4_ = fVar88 * auVar100._0_4_;
        auVar104._4_4_ = fVar88 * auVar100._4_4_;
        auVar104._8_4_ = fVar88 * auVar100._8_4_;
        auVar104._12_4_ = fVar88 * auVar100._12_4_;
        auVar100._0_4_ = fVar84 * auVar99._0_4_;
        auVar100._4_4_ = fVar84 * auVar99._4_4_;
        auVar100._8_4_ = fVar84 * auVar99._8_4_;
        auVar100._12_4_ = fVar84 * auVar99._12_4_;
        auVar52 = vunpcklps_avx(auVar102,auVar100);
        auVar53 = vunpckhps_avx(auVar102,auVar100);
        auVar102 = vunpcklps_avx(auVar104,auVar85);
        auVar100 = vunpckhps_avx(auVar104,auVar85);
        auVar100 = vunpcklps_avx(auVar53,auVar100);
        auVar99 = vunpcklps_avx(auVar52,auVar102);
        auVar53 = vunpckhps_avx(auVar52,auVar102);
        *(undefined1 (*) [16])(local_27a0 + lVar43) = auVar99;
        *(undefined1 (*) [16])(auStack_2790 + lVar43) = auVar53;
        *(undefined1 (*) [16])(auStack_2780 + lVar43) = auVar100;
      } while (uVar40 != 0);
      local_29e0._0_4_ = *(undefined4 *)ray;
      local_29e0._4_4_ = *(undefined4 *)(ray + 4);
      local_29e0._8_4_ = *(undefined4 *)(ray + 8);
      local_29e0._12_4_ = *(undefined4 *)(ray + 0xc);
      local_29e0._16_4_ = *(undefined4 *)(ray + 0x10);
      local_29e0._20_4_ = *(undefined4 *)(ray + 0x14);
      local_29e0._24_4_ = *(undefined4 *)(ray + 0x18);
      local_29e0._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_29e0._32_4_ = *(undefined4 *)(ray + 0x20);
      local_29e0._36_4_ = *(undefined4 *)(ray + 0x24);
      local_29e0._40_4_ = *(undefined4 *)(ray + 0x28);
      local_29e0._44_4_ = *(undefined4 *)(ray + 0x2c);
      local_29e0._48_4_ = *(undefined4 *)(ray + 0x30);
      local_29e0._52_4_ = *(undefined4 *)(ray + 0x34);
      local_29e0._56_4_ = *(undefined4 *)(ray + 0x38);
      local_29e0._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_29e0._64_4_ = *(undefined4 *)(ray + 0x40);
      local_29e0._68_4_ = *(undefined4 *)(ray + 0x44);
      local_29e0._72_4_ = *(undefined4 *)(ray + 0x48);
      local_29e0._76_4_ = *(undefined4 *)(ray + 0x4c);
      local_29e0._80_4_ = *(undefined4 *)(ray + 0x50);
      local_29e0._84_4_ = *(undefined4 *)(ray + 0x54);
      local_29e0._88_4_ = *(undefined4 *)(ray + 0x58);
      local_29e0._92_4_ = *(undefined4 *)(ray + 0x5c);
      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar109 = ZEXT3264(auVar56);
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar110 = ZEXT3264(auVar57);
      vandps_avx512vl(local_2980,auVar56);
      uVar40 = vcmpps_avx512vl(auVar57,auVar57,1);
      bVar47 = (bool)((byte)uVar40 & 1);
      iVar51 = auVar57._0_4_;
      auVar55._0_4_ = (uint)bVar47 * iVar51 | (uint)!bVar47 * local_2980._0_4_;
      bVar47 = (bool)((byte)(uVar40 >> 1) & 1);
      iVar72 = auVar57._4_4_;
      auVar55._4_4_ = (uint)bVar47 * iVar72 | (uint)!bVar47 * local_2980._4_4_;
      bVar47 = (bool)((byte)(uVar40 >> 2) & 1);
      iVar73 = auVar57._8_4_;
      auVar55._8_4_ = (uint)bVar47 * iVar73 | (uint)!bVar47 * local_2980._8_4_;
      bVar47 = (bool)((byte)(uVar40 >> 3) & 1);
      iVar74 = auVar57._12_4_;
      auVar55._12_4_ = (uint)bVar47 * iVar74 | (uint)!bVar47 * local_2980._12_4_;
      bVar47 = (bool)((byte)(uVar40 >> 4) & 1);
      iVar75 = auVar57._16_4_;
      auVar55._16_4_ = (uint)bVar47 * iVar75 | (uint)!bVar47 * local_2980._16_4_;
      bVar47 = (bool)((byte)(uVar40 >> 5) & 1);
      iVar76 = auVar57._20_4_;
      auVar55._20_4_ = (uint)bVar47 * iVar76 | (uint)!bVar47 * local_2980._20_4_;
      bVar47 = (bool)((byte)(uVar40 >> 6) & 1);
      iVar77 = auVar57._24_4_;
      iVar78 = auVar57._28_4_;
      auVar55._24_4_ = (uint)bVar47 * iVar77 | (uint)!bVar47 * local_2980._24_4_;
      bVar47 = SUB81(uVar40 >> 7,0);
      auVar55._28_4_ = (uint)bVar47 * iVar78 | (uint)!bVar47 * local_2980._28_4_;
      vandps_avx512vl(local_2960,auVar56);
      uVar40 = vcmpps_avx512vl(auVar55,auVar57,1);
      bVar47 = (bool)((byte)uVar40 & 1);
      auVar60._0_4_ = (uint)bVar47 * iVar51 | (uint)!bVar47 * local_2960._0_4_;
      bVar47 = (bool)((byte)(uVar40 >> 1) & 1);
      auVar60._4_4_ = (uint)bVar47 * iVar72 | (uint)!bVar47 * local_2960._4_4_;
      bVar47 = (bool)((byte)(uVar40 >> 2) & 1);
      auVar60._8_4_ = (uint)bVar47 * iVar73 | (uint)!bVar47 * local_2960._8_4_;
      bVar47 = (bool)((byte)(uVar40 >> 3) & 1);
      auVar60._12_4_ = (uint)bVar47 * iVar74 | (uint)!bVar47 * local_2960._12_4_;
      bVar47 = (bool)((byte)(uVar40 >> 4) & 1);
      auVar60._16_4_ = (uint)bVar47 * iVar75 | (uint)!bVar47 * local_2960._16_4_;
      bVar47 = (bool)((byte)(uVar40 >> 5) & 1);
      auVar60._20_4_ = (uint)bVar47 * iVar76 | (uint)!bVar47 * local_2960._20_4_;
      bVar47 = (bool)((byte)(uVar40 >> 6) & 1);
      auVar60._24_4_ = (uint)bVar47 * iVar77 | (uint)!bVar47 * local_2960._24_4_;
      bVar47 = SUB81(uVar40 >> 7,0);
      auVar60._28_4_ = (uint)bVar47 * iVar78 | (uint)!bVar47 * local_2960._28_4_;
      vandps_avx512vl(local_2940,auVar56);
      uVar40 = vcmpps_avx512vl(auVar60,auVar57,1);
      bVar47 = (bool)((byte)uVar40 & 1);
      auVar61._0_4_ = (uint)bVar47 * iVar51 | (uint)!bVar47 * (int)fVar11;
      bVar47 = (bool)((byte)(uVar40 >> 1) & 1);
      auVar61._4_4_ = (uint)bVar47 * iVar72 | (uint)!bVar47 * (int)fVar12;
      bVar47 = (bool)((byte)(uVar40 >> 2) & 1);
      auVar61._8_4_ = (uint)bVar47 * iVar73 | (uint)!bVar47 * (int)fVar13;
      bVar47 = (bool)((byte)(uVar40 >> 3) & 1);
      auVar61._12_4_ = (uint)bVar47 * iVar74 | (uint)!bVar47 * (int)fVar14;
      bVar47 = (bool)((byte)(uVar40 >> 4) & 1);
      auVar61._16_4_ = (uint)bVar47 * iVar75 | (uint)!bVar47 * (int)fVar15;
      bVar47 = (bool)((byte)(uVar40 >> 5) & 1);
      auVar61._20_4_ = (uint)bVar47 * iVar76 | (uint)!bVar47 * (int)fVar16;
      bVar47 = (bool)((byte)(uVar40 >> 6) & 1);
      auVar61._24_4_ = (uint)bVar47 * iVar77 | (uint)!bVar47 * (int)fVar17;
      bVar47 = SUB81(uVar40 >> 7,0);
      auVar61._28_4_ = (uint)bVar47 * iVar78 | (uint)!bVar47 * local_2940._28_4_;
      auVar56 = vrcp14ps_avx512vl(auVar55);
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar111 = ZEXT3264(auVar57);
      auVar53 = vxorps_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
      auVar112 = ZEXT1664(auVar53);
      auVar58 = vfnmadd213ps_avx512vl(auVar55,auVar56,auVar57);
      auVar54 = vfmadd132ps_fma(auVar58,auVar56,auVar56);
      auVar56 = vrcp14ps_avx512vl(auVar60);
      auVar58 = vfnmadd213ps_avx512vl(auVar60,auVar56,auVar57);
      auVar85 = vfmadd132ps_fma(auVar58,auVar56,auVar56);
      auVar56 = vrcp14ps_avx512vl(auVar61);
      auVar57 = vfnmadd213ps_avx512vl(auVar61,auVar56,auVar57);
      local_2920 = ZEXT1632(auVar54);
      local_2900 = ZEXT1632(auVar85);
      auVar81 = vfmadd132ps_fma(auVar57,auVar56,auVar56);
      local_28e0 = ZEXT1632(auVar81);
      local_28c0._4_4_ = (float)local_29e0._4_4_ * auVar54._4_4_;
      local_28c0._0_4_ = (float)local_29e0._0_4_ * auVar54._0_4_;
      local_28c0._8_4_ = (float)local_29e0._8_4_ * auVar54._8_4_;
      local_28c0._12_4_ = (float)local_29e0._12_4_ * auVar54._12_4_;
      local_28c0._16_4_ = (float)local_29e0._16_4_ * 0.0;
      local_28c0._20_4_ = (float)local_29e0._20_4_ * 0.0;
      local_28c0._24_4_ = (float)local_29e0._24_4_ * 0.0;
      local_28c0._28_4_ = local_29e0._28_4_;
      local_28a0._4_4_ = (float)local_29e0._36_4_ * auVar85._4_4_;
      local_28a0._0_4_ = (float)local_29e0._32_4_ * auVar85._0_4_;
      local_28a0._8_4_ = (float)local_29e0._40_4_ * auVar85._8_4_;
      local_28a0._12_4_ = (float)local_29e0._44_4_ * auVar85._12_4_;
      local_28a0._16_4_ = (float)local_29e0._48_4_ * 0.0;
      local_28a0._20_4_ = (float)local_29e0._52_4_ * 0.0;
      local_28a0._24_4_ = (float)local_29e0._56_4_ * 0.0;
      local_28a0._28_4_ = local_29e0._60_4_;
      local_2880._4_4_ = (float)local_29e0._68_4_ * auVar81._4_4_;
      local_2880._0_4_ = (float)local_29e0._64_4_ * auVar81._0_4_;
      local_2880._8_4_ = (float)local_29e0._72_4_ * auVar81._8_4_;
      local_2880._12_4_ = (float)local_29e0._76_4_ * auVar81._12_4_;
      local_2880._16_4_ = (float)local_29e0._80_4_ * 0.0;
      local_2880._20_4_ = (float)local_29e0._84_4_ * 0.0;
      local_2880._24_4_ = (float)local_29e0._88_4_ * 0.0;
      local_2880._28_4_ = local_29e0._92_4_;
      uVar40 = vcmpps_avx512vl(ZEXT1632(auVar54),ZEXT1632(auVar53),1);
      auVar56 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      local_2860._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar56._4_4_;
      local_2860._0_4_ = (uint)((byte)uVar40 & 1) * auVar56._0_4_;
      local_2860._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar56._8_4_;
      local_2860._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar56._12_4_;
      local_2860._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * auVar56._16_4_;
      local_2860._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * auVar56._20_4_;
      local_2860._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * auVar56._24_4_;
      local_2860._28_4_ = (uint)(byte)(uVar40 >> 7) * auVar56._28_4_;
      uVar40 = vcmpps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar53),5);
      auVar56 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar47 = (bool)((byte)uVar40 & 1);
      local_2840 = (uint)bVar47 * auVar56._0_4_ | (uint)!bVar47 * 0x30;
      bVar47 = (bool)((byte)(uVar40 >> 1) & 1);
      uStack_283c = (uint)bVar47 * auVar56._4_4_ | (uint)!bVar47 * 0x30;
      bVar47 = (bool)((byte)(uVar40 >> 2) & 1);
      uStack_2838 = (uint)bVar47 * auVar56._8_4_ | (uint)!bVar47 * 0x30;
      bVar47 = (bool)((byte)(uVar40 >> 3) & 1);
      uStack_2834 = (uint)bVar47 * auVar56._12_4_ | (uint)!bVar47 * 0x30;
      bVar47 = (bool)((byte)(uVar40 >> 4) & 1);
      uStack_2830 = (uint)bVar47 * auVar56._16_4_ | (uint)!bVar47 * 0x30;
      bVar47 = (bool)((byte)(uVar40 >> 5) & 1);
      uStack_282c = (uint)bVar47 * auVar56._20_4_ | (uint)!bVar47 * 0x30;
      bVar47 = (bool)((byte)(uVar40 >> 6) & 1);
      uStack_2828 = (uint)bVar47 * auVar56._24_4_ | (uint)!bVar47 * 0x30;
      bVar47 = SUB81(uVar40 >> 7,0);
      uStack_2824 = (uint)bVar47 * auVar56._28_4_ | (uint)!bVar47 * 0x30;
      auVar57 = ZEXT1632(auVar53);
      uVar40 = vcmpps_avx512vl(ZEXT1632(auVar81),auVar57,5);
      auVar56 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar47 = (bool)((byte)uVar40 & 1);
      local_2820 = (uint)bVar47 * auVar56._0_4_ | (uint)!bVar47 * 0x50;
      bVar47 = (bool)((byte)(uVar40 >> 1) & 1);
      uStack_281c = (uint)bVar47 * auVar56._4_4_ | (uint)!bVar47 * 0x50;
      bVar47 = (bool)((byte)(uVar40 >> 2) & 1);
      uStack_2818 = (uint)bVar47 * auVar56._8_4_ | (uint)!bVar47 * 0x50;
      bVar47 = (bool)((byte)(uVar40 >> 3) & 1);
      uStack_2814 = (uint)bVar47 * auVar56._12_4_ | (uint)!bVar47 * 0x50;
      bVar47 = (bool)((byte)(uVar40 >> 4) & 1);
      uStack_2810 = (uint)bVar47 * auVar56._16_4_ | (uint)!bVar47 * 0x50;
      bVar47 = (bool)((byte)(uVar40 >> 5) & 1);
      uStack_280c = (uint)bVar47 * auVar56._20_4_ | (uint)!bVar47 * 0x50;
      bVar47 = (bool)((byte)(uVar40 >> 6) & 1);
      uStack_2808 = (uint)bVar47 * auVar56._24_4_ | (uint)!bVar47 * 0x50;
      bVar47 = SUB81(uVar40 >> 7,0);
      uStack_2804 = (uint)bVar47 * auVar56._28_4_ | (uint)!bVar47 * 0x50;
      local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar114 = ZEXT3264(local_1e80);
      auVar56 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar57);
      local_2800 = (uint)(bVar39 & 1) * auVar56._0_4_ | (uint)!(bool)(bVar39 & 1) * local_1e80._0_4_
      ;
      bVar47 = (bool)((byte)(uVar48 >> 1) & 1);
      uStack_27fc = (uint)bVar47 * auVar56._4_4_ | (uint)!bVar47 * local_1e80._4_4_;
      bVar47 = (bool)((byte)(uVar48 >> 2) & 1);
      uStack_27f8 = (uint)bVar47 * auVar56._8_4_ | (uint)!bVar47 * local_1e80._8_4_;
      bVar47 = (bool)((byte)(uVar48 >> 3) & 1);
      uStack_27f4 = (uint)bVar47 * auVar56._12_4_ | (uint)!bVar47 * local_1e80._12_4_;
      bVar47 = (bool)((byte)(uVar48 >> 4) & 1);
      uStack_27f0 = (uint)bVar47 * auVar56._16_4_ | (uint)!bVar47 * local_1e80._16_4_;
      bVar47 = (bool)((byte)(uVar48 >> 5) & 1);
      uStack_27ec = (uint)bVar47 * auVar56._20_4_ | (uint)!bVar47 * local_1e80._20_4_;
      bVar47 = (bool)((byte)(uVar48 >> 6) & 1);
      uStack_27e8 = (uint)bVar47 * auVar56._24_4_ | (uint)!bVar47 * local_1e80._24_4_;
      bVar47 = SUB81(uVar48 >> 7,0);
      uStack_27e4 = (uint)bVar47 * auVar56._28_4_ | (uint)!bVar47 * local_1e80._28_4_;
      auVar56 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar113 = ZEXT3264(auVar56);
      auVar59 = vmaxps_avx512vl(auVar59,auVar57);
      local_27e0._0_4_ =
           (uint)(bVar39 & 1) * auVar59._0_4_ | (uint)!(bool)(bVar39 & 1) * auVar56._0_4_;
      bVar47 = (bool)((byte)(uVar48 >> 1) & 1);
      local_27e0._4_4_ = (uint)bVar47 * auVar59._4_4_ | (uint)!bVar47 * auVar56._4_4_;
      bVar47 = (bool)((byte)(uVar48 >> 2) & 1);
      local_27e0._8_4_ = (uint)bVar47 * auVar59._8_4_ | (uint)!bVar47 * auVar56._8_4_;
      bVar47 = (bool)((byte)(uVar48 >> 3) & 1);
      local_27e0._12_4_ = (uint)bVar47 * auVar59._12_4_ | (uint)!bVar47 * auVar56._12_4_;
      bVar47 = (bool)((byte)(uVar48 >> 4) & 1);
      local_27e0._16_4_ = (uint)bVar47 * auVar59._16_4_ | (uint)!bVar47 * auVar56._16_4_;
      bVar47 = (bool)((byte)(uVar48 >> 5) & 1);
      local_27e0._20_4_ = (uint)bVar47 * auVar59._20_4_ | (uint)!bVar47 * auVar56._20_4_;
      bVar47 = (bool)((byte)(uVar48 >> 6) & 1);
      local_27e0._24_4_ = (uint)bVar47 * auVar59._24_4_ | (uint)!bVar47 * auVar56._24_4_;
      bVar47 = SUB81(uVar48 >> 7,0);
      local_27e0._28_4_ = (uint)bVar47 * auVar59._28_4_ | (uint)!bVar47 * auVar56._28_4_;
      bVar39 = ~bVar39;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar44 = 5;
      }
      else {
        uVar44 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      puVar45 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar46 = (undefined1 (*) [32])local_1e40;
      local_2608 = (bvh->root).ptr;
      local_1e60 = local_2800;
      uStack_1e5c = uStack_27fc;
      uStack_1e58 = uStack_27f8;
      uStack_1e54 = uStack_27f4;
      uStack_1e50 = uStack_27f0;
      uStack_1e4c = uStack_27ec;
      uStack_1e48 = uStack_27e8;
      uStack_1e44 = uStack_27e4;
      do {
        pauVar46 = pauVar46 + -1;
        root.ptr = puVar45[-1];
        puVar45 = puVar45 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_007b309c:
          iVar51 = 3;
        }
        else {
          auVar59 = *pauVar46;
          uVar40 = vcmpps_avx512vl(auVar59,local_27e0,1);
          if ((char)uVar40 == '\0') {
LAB_007b30a0:
            iVar51 = 2;
          }
          else {
            uVar42 = (undefined4)uVar40;
            iVar51 = 0;
            if ((uint)POPCOUNT(uVar42) <= uVar44) {
              do {
                k = 0;
                for (uVar50 = uVar40; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000)
                {
                  k = k + 1;
                }
                bVar47 = occluded1(This,bvh,root,k,(Precalculations *)&local_27c0,ray,
                                   (TravRayK<8,_false> *)&local_29e0.field_0,context);
                bVar38 = (byte)(1 << ((uint)k & 0x1f));
                if (!bVar47) {
                  bVar38 = 0;
                }
                bVar39 = bVar39 | bVar38;
                uVar40 = uVar40 - 1 & uVar40;
              } while (uVar40 != 0);
              if (bVar39 == 0xff) {
                iVar51 = 3;
              }
              else {
                auVar56 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar47 = (bool)(bVar39 >> 1 & 1);
                bVar4 = (bool)(bVar39 >> 2 & 1);
                bVar5 = (bool)(bVar39 >> 3 & 1);
                bVar6 = (bool)(bVar39 >> 4 & 1);
                bVar7 = (bool)(bVar39 >> 5 & 1);
                bVar8 = (bool)(bVar39 >> 6 & 1);
                local_27e0._4_4_ = (uint)bVar47 * auVar56._4_4_ | (uint)!bVar47 * local_27e0._4_4_;
                local_27e0._0_4_ =
                     (uint)(bVar39 & 1) * auVar56._0_4_ |
                     (uint)!(bool)(bVar39 & 1) * local_27e0._0_4_;
                local_27e0._8_4_ = (uint)bVar4 * auVar56._8_4_ | (uint)!bVar4 * local_27e0._8_4_;
                local_27e0._12_4_ = (uint)bVar5 * auVar56._12_4_ | (uint)!bVar5 * local_27e0._12_4_;
                local_27e0._16_4_ = (uint)bVar6 * auVar56._16_4_ | (uint)!bVar6 * local_27e0._16_4_;
                local_27e0._20_4_ = (uint)bVar7 * auVar56._20_4_ | (uint)!bVar7 * local_27e0._20_4_;
                local_27e0._24_4_ = (uint)bVar8 * auVar56._24_4_ | (uint)!bVar8 * local_27e0._24_4_;
                local_27e0._28_4_ =
                     (uint)(bVar39 >> 7) * auVar56._28_4_ |
                     (uint)!(bool)(bVar39 >> 7) * local_27e0._28_4_;
                iVar51 = 2;
              }
              uVar48 = uVar48 & 0xffffffff;
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar109 = ZEXT3264(auVar56);
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
              auVar110 = ZEXT3264(auVar56);
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar111 = ZEXT3264(auVar56);
              auVar54 = vxorps_avx512vl(auVar112._0_16_,auVar112._0_16_);
              auVar112 = ZEXT1664(auVar54);
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar113 = ZEXT3264(auVar56);
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar114 = ZEXT3264(auVar56);
            }
            auVar54 = auVar112._0_16_;
            auVar115 = ZEXT3264(auVar59);
            if (uVar44 < (uint)POPCOUNT(uVar42)) {
              do {
                auVar59 = auVar115._0_32_;
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_007b309c;
                  uVar18 = vcmpps_avx512vl(auVar59,local_27e0,9);
                  if ((char)uVar18 != '\0') {
                    if (bVar39 == 0xff) {
                      bVar38 = 0;
                    }
                    else {
                      uVar40 = (ulong)(byte)~bVar39;
                      bVar1 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                      pvVar3 = This->leafIntersector;
                      bVar38 = 0;
                      do {
                        lVar43 = 0;
                        for (uVar50 = uVar40; (uVar50 & 1) == 0;
                            uVar50 = uVar50 >> 1 | 0x8000000000000000) {
                          lVar43 = lVar43 + 1;
                        }
                        cVar37 = (**(code **)((long)pvVar3 + (ulong)bVar1 * 0x40 + 0x28))
                                           (&local_27c0,ray,lVar43,context,
                                            (byte *)(root.ptr & 0xfffffffffffffff0));
                        auVar54 = auVar112._0_16_;
                        bVar32 = (byte)(1 << ((uint)lVar43 & 0x1f));
                        if (cVar37 == '\0') {
                          bVar32 = 0;
                        }
                        bVar38 = bVar38 | bVar32;
                        uVar40 = uVar40 - 1 & uVar40;
                      } while (uVar40 != 0);
                    }
                    bVar39 = bVar39 | bVar38;
                    if (bVar39 == 0xff) {
                      iVar51 = 3;
                    }
                    else {
                      auVar59 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar47 = (bool)(bVar39 >> 1 & 1);
                      bVar4 = (bool)(bVar39 >> 2 & 1);
                      bVar5 = (bool)(bVar39 >> 3 & 1);
                      bVar6 = (bool)(bVar39 >> 4 & 1);
                      bVar7 = (bool)(bVar39 >> 5 & 1);
                      bVar8 = (bool)(bVar39 >> 6 & 1);
                      local_27e0._4_4_ =
                           (uint)bVar47 * auVar59._4_4_ | (uint)!bVar47 * local_27e0._4_4_;
                      local_27e0._0_4_ =
                           (uint)(bVar39 & 1) * auVar59._0_4_ |
                           (uint)!(bool)(bVar39 & 1) * local_27e0._0_4_;
                      local_27e0._8_4_ =
                           (uint)bVar4 * auVar59._8_4_ | (uint)!bVar4 * local_27e0._8_4_;
                      local_27e0._12_4_ =
                           (uint)bVar5 * auVar59._12_4_ | (uint)!bVar5 * local_27e0._12_4_;
                      local_27e0._16_4_ =
                           (uint)bVar6 * auVar59._16_4_ | (uint)!bVar6 * local_27e0._16_4_;
                      local_27e0._20_4_ =
                           (uint)bVar7 * auVar59._20_4_ | (uint)!bVar7 * local_27e0._20_4_;
                      local_27e0._24_4_ =
                           (uint)bVar8 * auVar59._24_4_ | (uint)!bVar8 * local_27e0._24_4_;
                      local_27e0._28_4_ =
                           (uint)(bVar39 >> 7) * auVar59._28_4_ |
                           (uint)!(bool)(bVar39 >> 7) * local_27e0._28_4_;
                      iVar51 = 0;
                    }
                    uVar48 = uVar48 & 0xffffffff;
                    auVar59 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar109 = ZEXT3264(auVar59);
                    auVar59 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                    auVar110 = ZEXT3264(auVar59);
                    auVar59 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar111 = ZEXT3264(auVar59);
                    auVar54 = vxorps_avx512vl(auVar54,auVar54);
                    auVar112 = ZEXT1664(auVar54);
                    auVar59 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    auVar113 = ZEXT3264(auVar59);
                    auVar59 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar114 = ZEXT3264(auVar59);
                    break;
                  }
                  goto LAB_007b30a0;
                }
                uVar50 = root.ptr & 0xfffffffffffffff0;
                uVar41 = (uint)root.ptr & 7;
                root.ptr = 8;
                auVar115 = ZEXT3264(auVar114._0_32_);
                uVar40 = 0;
                do {
                  uVar2 = *(ulong *)(uVar50 + uVar40 * 8);
                  if (uVar2 != 8) {
                    if ((uVar41 == 6) || (uVar41 == 1)) {
                      uVar42 = *(undefined4 *)(uVar50 + 0x80 + uVar40 * 4);
                      auVar82._4_4_ = uVar42;
                      auVar82._0_4_ = uVar42;
                      auVar82._8_4_ = uVar42;
                      auVar82._12_4_ = uVar42;
                      auVar82._16_4_ = uVar42;
                      auVar82._20_4_ = uVar42;
                      auVar82._24_4_ = uVar42;
                      auVar82._28_4_ = uVar42;
                      auVar56 = *(undefined1 (*) [32])(ray + 0xe0);
                      uVar42 = *(undefined4 *)(uVar50 + 0x20 + uVar40 * 4);
                      auVar62._4_4_ = uVar42;
                      auVar62._0_4_ = uVar42;
                      auVar62._8_4_ = uVar42;
                      auVar62._12_4_ = uVar42;
                      auVar62._16_4_ = uVar42;
                      auVar62._20_4_ = uVar42;
                      auVar62._24_4_ = uVar42;
                      auVar62._28_4_ = uVar42;
                      auVar57 = vfmadd213ps_avx512vl(auVar82,auVar56,auVar62);
                      uVar42 = *(undefined4 *)(uVar50 + 0xa0 + uVar40 * 4);
                      auVar86._4_4_ = uVar42;
                      auVar86._0_4_ = uVar42;
                      auVar86._8_4_ = uVar42;
                      auVar86._12_4_ = uVar42;
                      auVar86._16_4_ = uVar42;
                      auVar86._20_4_ = uVar42;
                      auVar86._24_4_ = uVar42;
                      auVar86._28_4_ = uVar42;
                      uVar42 = *(undefined4 *)(uVar50 + 0x40 + uVar40 * 4);
                      auVar63._4_4_ = uVar42;
                      auVar63._0_4_ = uVar42;
                      auVar63._8_4_ = uVar42;
                      auVar63._12_4_ = uVar42;
                      auVar63._16_4_ = uVar42;
                      auVar63._20_4_ = uVar42;
                      auVar63._24_4_ = uVar42;
                      auVar63._28_4_ = uVar42;
                      auVar58 = vfmadd213ps_avx512vl(auVar86,auVar56,auVar63);
                      uVar42 = *(undefined4 *)(uVar50 + 0xc0 + uVar40 * 4);
                      auVar94._4_4_ = uVar42;
                      auVar94._0_4_ = uVar42;
                      auVar94._8_4_ = uVar42;
                      auVar94._12_4_ = uVar42;
                      auVar94._16_4_ = uVar42;
                      auVar94._20_4_ = uVar42;
                      auVar94._24_4_ = uVar42;
                      auVar94._28_4_ = uVar42;
                      uVar42 = *(undefined4 *)(uVar50 + 0x60 + uVar40 * 4);
                      auVar64._4_4_ = uVar42;
                      auVar64._0_4_ = uVar42;
                      auVar64._8_4_ = uVar42;
                      auVar64._12_4_ = uVar42;
                      auVar64._16_4_ = uVar42;
                      auVar64._20_4_ = uVar42;
                      auVar64._24_4_ = uVar42;
                      auVar64._28_4_ = uVar42;
                      auVar55 = vfmadd213ps_avx512vl(auVar94,auVar56,auVar64);
                      uVar42 = *(undefined4 *)(uVar50 + 0x90 + uVar40 * 4);
                      auVar96._4_4_ = uVar42;
                      auVar96._0_4_ = uVar42;
                      auVar96._8_4_ = uVar42;
                      auVar96._12_4_ = uVar42;
                      auVar96._16_4_ = uVar42;
                      auVar96._20_4_ = uVar42;
                      auVar96._24_4_ = uVar42;
                      auVar96._28_4_ = uVar42;
                      uVar42 = *(undefined4 *)(uVar50 + 0x30 + uVar40 * 4);
                      auVar68._4_4_ = uVar42;
                      auVar68._0_4_ = uVar42;
                      auVar68._8_4_ = uVar42;
                      auVar68._12_4_ = uVar42;
                      auVar68._16_4_ = uVar42;
                      auVar68._20_4_ = uVar42;
                      auVar68._24_4_ = uVar42;
                      auVar68._28_4_ = uVar42;
                      auVar60 = vfmadd213ps_avx512vl(auVar96,auVar56,auVar68);
                      uVar42 = *(undefined4 *)(uVar50 + 0xb0 + uVar40 * 4);
                      auVar98._4_4_ = uVar42;
                      auVar98._0_4_ = uVar42;
                      auVar98._8_4_ = uVar42;
                      auVar98._12_4_ = uVar42;
                      auVar98._16_4_ = uVar42;
                      auVar98._20_4_ = uVar42;
                      auVar98._24_4_ = uVar42;
                      auVar98._28_4_ = uVar42;
                      uVar42 = *(undefined4 *)(uVar50 + 0x50 + uVar40 * 4);
                      auVar69._4_4_ = uVar42;
                      auVar69._0_4_ = uVar42;
                      auVar69._8_4_ = uVar42;
                      auVar69._12_4_ = uVar42;
                      auVar69._16_4_ = uVar42;
                      auVar69._20_4_ = uVar42;
                      auVar69._24_4_ = uVar42;
                      auVar69._28_4_ = uVar42;
                      auVar61 = vfmadd213ps_avx512vl(auVar98,auVar56,auVar69);
                      uVar42 = *(undefined4 *)(uVar50 + 0xd0 + uVar40 * 4);
                      auVar101._4_4_ = uVar42;
                      auVar101._0_4_ = uVar42;
                      auVar101._8_4_ = uVar42;
                      auVar101._12_4_ = uVar42;
                      auVar101._16_4_ = uVar42;
                      auVar101._20_4_ = uVar42;
                      auVar101._24_4_ = uVar42;
                      auVar101._28_4_ = uVar42;
                      uVar42 = *(undefined4 *)(uVar50 + 0x70 + uVar40 * 4);
                      auVar70._4_4_ = uVar42;
                      auVar70._0_4_ = uVar42;
                      auVar70._8_4_ = uVar42;
                      auVar70._12_4_ = uVar42;
                      auVar70._16_4_ = uVar42;
                      auVar70._20_4_ = uVar42;
                      auVar70._24_4_ = uVar42;
                      auVar70._28_4_ = uVar42;
                      auVar62 = vfmadd213ps_avx512vl(auVar101,auVar56,auVar70);
                      auVar85 = vfmsub213ps_fma(auVar57,local_2920,local_28c0);
                      auVar81 = vfmsub213ps_fma(auVar58,local_2900,local_28a0);
                      auVar53 = vfmsub213ps_fma(auVar55,local_28e0,local_2880);
                      auVar100 = vfmsub213ps_fma(auVar60,local_2920,local_28c0);
                      auVar52 = vfmsub213ps_fma(auVar61,local_2900,local_28a0);
                      auVar102 = vfmsub213ps_fma(auVar62,local_28e0,local_2880);
                      auVar57 = vpminsd_avx2(ZEXT1632(auVar85),ZEXT1632(auVar100));
                      auVar58 = vpminsd_avx2(ZEXT1632(auVar81),ZEXT1632(auVar52));
                      auVar57 = vpmaxsd_avx2(auVar57,auVar58);
                      auVar58 = vpminsd_avx2(ZEXT1632(auVar53),ZEXT1632(auVar102));
                      auVar57 = vpmaxsd_avx2(auVar57,auVar58);
                      auVar58 = vpmaxsd_avx2(ZEXT1632(auVar85),ZEXT1632(auVar100));
                      auVar55 = vpmaxsd_avx2(ZEXT1632(auVar81),ZEXT1632(auVar52));
                      auVar55 = vpminsd_avx2(auVar58,auVar55);
                      auVar58 = vpmaxsd_avx2(ZEXT1632(auVar53),ZEXT1632(auVar102));
                      auVar55 = vpminsd_avx2(auVar55,auVar58);
                      auVar71._4_4_ = uStack_27fc;
                      auVar71._0_4_ = local_2800;
                      auVar71._8_4_ = uStack_27f8;
                      auVar71._12_4_ = uStack_27f4;
                      auVar71._16_4_ = uStack_27f0;
                      auVar71._20_4_ = uStack_27ec;
                      auVar71._24_4_ = uStack_27e8;
                      auVar71._28_4_ = uStack_27e4;
                      auVar58 = vpmaxsd_avx2(auVar57,auVar71);
                      auVar55 = vpminsd_avx2(auVar55,local_27e0);
                      uVar49 = vcmpps_avx512vl(auVar58,auVar55,2);
                      if (uVar41 == 6) {
                        uVar42 = *(undefined4 *)(uVar50 + 0xe0 + uVar40 * 4);
                        auVar21._4_4_ = uVar42;
                        auVar21._0_4_ = uVar42;
                        auVar21._8_4_ = uVar42;
                        auVar21._12_4_ = uVar42;
                        auVar21._16_4_ = uVar42;
                        auVar21._20_4_ = uVar42;
                        auVar21._24_4_ = uVar42;
                        auVar21._28_4_ = uVar42;
                        uVar19 = vcmpps_avx512vl(auVar56,auVar21,0xd);
                        uVar42 = *(undefined4 *)(uVar50 + 0xf0 + uVar40 * 4);
                        auVar22._4_4_ = uVar42;
                        auVar22._0_4_ = uVar42;
                        auVar22._8_4_ = uVar42;
                        auVar22._12_4_ = uVar42;
                        auVar22._16_4_ = uVar42;
                        auVar22._20_4_ = uVar42;
                        auVar22._24_4_ = uVar42;
                        auVar22._28_4_ = uVar42;
                        uVar20 = vcmpps_avx512vl(auVar56,auVar22,1);
                        uVar49 = uVar49 & uVar19 & uVar20;
                      }
                    }
                    else {
                      uVar42 = *(undefined4 *)(uVar50 + 0x20 + uVar40 * 4);
                      auVar97._4_4_ = uVar42;
                      auVar97._0_4_ = uVar42;
                      auVar97._8_4_ = uVar42;
                      auVar97._12_4_ = uVar42;
                      auVar97._16_4_ = uVar42;
                      auVar97._20_4_ = uVar42;
                      auVar97._24_4_ = uVar42;
                      auVar97._28_4_ = uVar42;
                      uVar42 = *(undefined4 *)(uVar50 + 0x30 + uVar40 * 4);
                      auVar95._4_4_ = uVar42;
                      auVar95._0_4_ = uVar42;
                      auVar95._8_4_ = uVar42;
                      auVar95._12_4_ = uVar42;
                      auVar95._16_4_ = uVar42;
                      auVar95._20_4_ = uVar42;
                      auVar95._24_4_ = uVar42;
                      auVar95._28_4_ = uVar42;
                      uVar42 = *(undefined4 *)(uVar50 + 0x40 + uVar40 * 4);
                      auVar87._4_4_ = uVar42;
                      auVar87._0_4_ = uVar42;
                      auVar87._8_4_ = uVar42;
                      auVar87._12_4_ = uVar42;
                      auVar87._16_4_ = uVar42;
                      auVar87._20_4_ = uVar42;
                      auVar87._24_4_ = uVar42;
                      auVar87._28_4_ = uVar42;
                      uVar42 = *(undefined4 *)(uVar50 + 0x50 + uVar40 * 4);
                      auVar108._4_4_ = uVar42;
                      auVar108._0_4_ = uVar42;
                      auVar108._8_4_ = uVar42;
                      auVar108._12_4_ = uVar42;
                      auVar108._16_4_ = uVar42;
                      auVar108._20_4_ = uVar42;
                      auVar108._24_4_ = uVar42;
                      auVar108._28_4_ = uVar42;
                      uVar42 = *(undefined4 *)(uVar50 + 0x60 + uVar40 * 4);
                      auVar105._4_4_ = uVar42;
                      auVar105._0_4_ = uVar42;
                      auVar105._8_4_ = uVar42;
                      auVar105._12_4_ = uVar42;
                      auVar105._16_4_ = uVar42;
                      auVar105._20_4_ = uVar42;
                      auVar105._24_4_ = uVar42;
                      auVar105._28_4_ = uVar42;
                      uVar42 = *(undefined4 *)(uVar50 + 0x70 + uVar40 * 4);
                      auVar103._4_4_ = uVar42;
                      auVar103._0_4_ = uVar42;
                      auVar103._8_4_ = uVar42;
                      auVar103._12_4_ = uVar42;
                      auVar103._16_4_ = uVar42;
                      auVar103._20_4_ = uVar42;
                      auVar103._24_4_ = uVar42;
                      auVar103._28_4_ = uVar42;
                      uVar42 = *(undefined4 *)(uVar50 + 0x80 + uVar40 * 4);
                      auVar83._4_4_ = uVar42;
                      auVar83._0_4_ = uVar42;
                      auVar83._8_4_ = uVar42;
                      auVar83._12_4_ = uVar42;
                      auVar83._16_4_ = uVar42;
                      auVar83._20_4_ = uVar42;
                      auVar83._24_4_ = uVar42;
                      auVar83._28_4_ = uVar42;
                      uVar42 = *(undefined4 *)(uVar50 + 0x90 + uVar40 * 4);
                      auVar80._4_4_ = uVar42;
                      auVar80._0_4_ = uVar42;
                      auVar80._8_4_ = uVar42;
                      auVar80._12_4_ = uVar42;
                      auVar80._16_4_ = uVar42;
                      auVar80._20_4_ = uVar42;
                      auVar80._24_4_ = uVar42;
                      auVar80._28_4_ = uVar42;
                      uVar42 = *(undefined4 *)(uVar50 + 0xa0 + uVar40 * 4);
                      auVar79._4_4_ = uVar42;
                      auVar79._0_4_ = uVar42;
                      auVar79._8_4_ = uVar42;
                      auVar79._12_4_ = uVar42;
                      auVar79._16_4_ = uVar42;
                      auVar79._20_4_ = uVar42;
                      auVar79._24_4_ = uVar42;
                      auVar79._28_4_ = uVar42;
                      auVar56 = *(undefined1 (*) [32])(ray + 0xe0);
                      auVar70 = auVar111._0_32_;
                      auVar57 = vsubps_avx512vl(auVar70,auVar56);
                      uVar42 = *(undefined4 *)(uVar50 + 0xe0 + uVar40 * 4);
                      auVar23._4_4_ = uVar42;
                      auVar23._0_4_ = uVar42;
                      auVar23._8_4_ = uVar42;
                      auVar23._12_4_ = uVar42;
                      auVar23._16_4_ = uVar42;
                      auVar23._20_4_ = uVar42;
                      auVar23._24_4_ = uVar42;
                      auVar23._28_4_ = uVar42;
                      auVar58 = vmulps_avx512vl(auVar56,auVar23);
                      uVar42 = *(undefined4 *)(uVar50 + 0xf0 + uVar40 * 4);
                      auVar24._4_4_ = uVar42;
                      auVar24._0_4_ = uVar42;
                      auVar24._8_4_ = uVar42;
                      auVar24._12_4_ = uVar42;
                      auVar24._16_4_ = uVar42;
                      auVar24._20_4_ = uVar42;
                      auVar24._24_4_ = uVar42;
                      auVar24._28_4_ = uVar42;
                      auVar55 = vmulps_avx512vl(auVar56,auVar24);
                      uVar42 = *(undefined4 *)(uVar50 + 0x100 + uVar40 * 4);
                      auVar25._4_4_ = uVar42;
                      auVar25._0_4_ = uVar42;
                      auVar25._8_4_ = uVar42;
                      auVar25._12_4_ = uVar42;
                      auVar25._16_4_ = uVar42;
                      auVar25._20_4_ = uVar42;
                      auVar25._24_4_ = uVar42;
                      auVar25._28_4_ = uVar42;
                      auVar60 = vmulps_avx512vl(auVar56,auVar25);
                      auVar63 = auVar112._0_32_;
                      auVar58 = vfmadd231ps_avx512vl(auVar58,auVar57,auVar63);
                      auVar55 = vfmadd231ps_avx512vl(auVar55,auVar57,auVar63);
                      uVar42 = *(undefined4 *)(uVar50 + 0x110 + uVar40 * 4);
                      auVar26._4_4_ = uVar42;
                      auVar26._0_4_ = uVar42;
                      auVar26._8_4_ = uVar42;
                      auVar26._12_4_ = uVar42;
                      auVar26._16_4_ = uVar42;
                      auVar26._20_4_ = uVar42;
                      auVar26._24_4_ = uVar42;
                      auVar26._28_4_ = uVar42;
                      auVar61 = vmulps_avx512vl(auVar56,auVar26);
                      uVar42 = *(undefined4 *)(uVar50 + 0x120 + uVar40 * 4);
                      auVar27._4_4_ = uVar42;
                      auVar27._0_4_ = uVar42;
                      auVar27._8_4_ = uVar42;
                      auVar27._12_4_ = uVar42;
                      auVar27._16_4_ = uVar42;
                      auVar27._20_4_ = uVar42;
                      auVar27._24_4_ = uVar42;
                      auVar27._28_4_ = uVar42;
                      auVar62 = vmulps_avx512vl(auVar56,auVar27);
                      auVar60 = vfmadd231ps_avx512vl(auVar60,auVar57,auVar63);
                      uVar42 = *(undefined4 *)(uVar50 + 0x130 + uVar40 * 4);
                      auVar28._4_4_ = uVar42;
                      auVar28._0_4_ = uVar42;
                      auVar28._8_4_ = uVar42;
                      auVar28._12_4_ = uVar42;
                      auVar28._16_4_ = uVar42;
                      auVar28._20_4_ = uVar42;
                      auVar28._24_4_ = uVar42;
                      auVar28._28_4_ = uVar42;
                      auVar56 = vmulps_avx512vl(auVar56,auVar28);
                      auVar61 = vaddps_avx512vl(auVar57,auVar61);
                      auVar62 = vaddps_avx512vl(auVar57,auVar62);
                      auVar57 = vaddps_avx512vl(auVar57,auVar56);
                      auVar33._4_4_ = local_29e0._4_4_;
                      auVar33._0_4_ = local_29e0._0_4_;
                      auVar33._8_4_ = local_29e0._8_4_;
                      auVar33._12_4_ = local_29e0._12_4_;
                      auVar33._16_4_ = local_29e0._16_4_;
                      auVar33._20_4_ = local_29e0._20_4_;
                      auVar33._24_4_ = local_29e0._24_4_;
                      auVar33._28_4_ = local_29e0._28_4_;
                      auVar34._4_4_ = local_29e0._36_4_;
                      auVar34._0_4_ = local_29e0._32_4_;
                      auVar34._8_4_ = local_29e0._40_4_;
                      auVar34._12_4_ = local_29e0._44_4_;
                      auVar34._16_4_ = local_29e0._48_4_;
                      auVar34._20_4_ = local_29e0._52_4_;
                      auVar34._24_4_ = local_29e0._56_4_;
                      auVar34._28_4_ = local_29e0._60_4_;
                      auVar35._4_4_ = local_29e0._68_4_;
                      auVar35._0_4_ = local_29e0._64_4_;
                      auVar35._8_4_ = local_29e0._72_4_;
                      auVar35._12_4_ = local_29e0._76_4_;
                      auVar35._16_4_ = local_29e0._80_4_;
                      auVar35._20_4_ = local_29e0._84_4_;
                      auVar35._24_4_ = local_29e0._88_4_;
                      auVar35._28_4_ = local_29e0._92_4_;
                      auVar56 = vmulps_avx512vl(auVar83,local_2940);
                      auVar63 = vmulps_avx512vl(auVar80,local_2940);
                      auVar64 = vmulps_avx512vl(auVar79,local_2940);
                      auVar56 = vfmadd231ps_avx512vl(auVar56,local_2960,auVar108);
                      auVar63 = vfmadd231ps_avx512vl(auVar63,local_2960,auVar105);
                      auVar64 = vfmadd231ps_avx512vl(auVar64,auVar103,local_2960);
                      auVar56 = vfmadd231ps_avx512vl(auVar56,local_2980,auVar97);
                      auVar63 = vfmadd231ps_avx512vl(auVar63,local_2980,auVar95);
                      auVar64 = vfmadd231ps_avx512vl(auVar64,auVar87,local_2980);
                      auVar68 = auVar109._0_32_;
                      vandps_avx512vl(auVar56,auVar68);
                      auVar69 = auVar110._0_32_;
                      uVar49 = vcmpps_avx512vl(auVar64,auVar69,1);
                      bVar47 = (bool)((byte)uVar49 & 1);
                      iVar51 = auVar110._0_4_;
                      auVar65._0_4_ = (uint)bVar47 * iVar51 | (uint)!bVar47 * auVar56._0_4_;
                      bVar47 = (bool)((byte)(uVar49 >> 1) & 1);
                      iVar72 = auVar110._4_4_;
                      auVar65._4_4_ = (uint)bVar47 * iVar72 | (uint)!bVar47 * auVar56._4_4_;
                      bVar47 = (bool)((byte)(uVar49 >> 2) & 1);
                      iVar73 = auVar110._8_4_;
                      auVar65._8_4_ = (uint)bVar47 * iVar73 | (uint)!bVar47 * auVar56._8_4_;
                      bVar47 = (bool)((byte)(uVar49 >> 3) & 1);
                      iVar74 = auVar110._12_4_;
                      auVar65._12_4_ = (uint)bVar47 * iVar74 | (uint)!bVar47 * auVar56._12_4_;
                      bVar47 = (bool)((byte)(uVar49 >> 4) & 1);
                      iVar75 = auVar110._16_4_;
                      auVar65._16_4_ = (uint)bVar47 * iVar75 | (uint)!bVar47 * auVar56._16_4_;
                      bVar47 = (bool)((byte)(uVar49 >> 5) & 1);
                      iVar76 = auVar110._20_4_;
                      auVar65._20_4_ = (uint)bVar47 * iVar76 | (uint)!bVar47 * auVar56._20_4_;
                      bVar47 = (bool)((byte)(uVar49 >> 6) & 1);
                      iVar77 = auVar110._24_4_;
                      iVar78 = auVar110._28_4_;
                      auVar65._24_4_ = (uint)bVar47 * iVar77 | (uint)!bVar47 * auVar56._24_4_;
                      bVar47 = SUB81(uVar49 >> 7,0);
                      auVar65._28_4_ = (uint)bVar47 * iVar78 | (uint)!bVar47 * auVar56._28_4_;
                      vandps_avx512vl(auVar63,auVar68);
                      uVar49 = vcmpps_avx512vl(auVar65,auVar69,1);
                      bVar47 = (bool)((byte)uVar49 & 1);
                      auVar66._0_4_ = (uint)bVar47 * iVar51 | (uint)!bVar47 * auVar63._0_4_;
                      bVar47 = (bool)((byte)(uVar49 >> 1) & 1);
                      auVar66._4_4_ = (uint)bVar47 * iVar72 | (uint)!bVar47 * auVar63._4_4_;
                      bVar47 = (bool)((byte)(uVar49 >> 2) & 1);
                      auVar66._8_4_ = (uint)bVar47 * iVar73 | (uint)!bVar47 * auVar63._8_4_;
                      bVar47 = (bool)((byte)(uVar49 >> 3) & 1);
                      auVar66._12_4_ = (uint)bVar47 * iVar74 | (uint)!bVar47 * auVar63._12_4_;
                      bVar47 = (bool)((byte)(uVar49 >> 4) & 1);
                      auVar66._16_4_ = (uint)bVar47 * iVar75 | (uint)!bVar47 * auVar63._16_4_;
                      bVar47 = (bool)((byte)(uVar49 >> 5) & 1);
                      auVar66._20_4_ = (uint)bVar47 * iVar76 | (uint)!bVar47 * auVar63._20_4_;
                      bVar47 = (bool)((byte)(uVar49 >> 6) & 1);
                      auVar66._24_4_ = (uint)bVar47 * iVar77 | (uint)!bVar47 * auVar63._24_4_;
                      bVar47 = SUB81(uVar49 >> 7,0);
                      auVar66._28_4_ = (uint)bVar47 * iVar78 | (uint)!bVar47 * auVar63._28_4_;
                      vandps_avx512vl(auVar64,auVar68);
                      uVar49 = vcmpps_avx512vl(auVar66,auVar69,1);
                      bVar47 = (bool)((byte)uVar49 & 1);
                      auVar67._0_4_ = (uint)bVar47 * iVar51 | (uint)!bVar47 * auVar64._0_4_;
                      bVar47 = (bool)((byte)(uVar49 >> 1) & 1);
                      auVar67._4_4_ = (uint)bVar47 * iVar72 | (uint)!bVar47 * auVar64._4_4_;
                      bVar47 = (bool)((byte)(uVar49 >> 2) & 1);
                      auVar67._8_4_ = (uint)bVar47 * iVar73 | (uint)!bVar47 * auVar64._8_4_;
                      bVar47 = (bool)((byte)(uVar49 >> 3) & 1);
                      auVar67._12_4_ = (uint)bVar47 * iVar74 | (uint)!bVar47 * auVar64._12_4_;
                      bVar47 = (bool)((byte)(uVar49 >> 4) & 1);
                      auVar67._16_4_ = (uint)bVar47 * iVar75 | (uint)!bVar47 * auVar64._16_4_;
                      bVar47 = (bool)((byte)(uVar49 >> 5) & 1);
                      auVar67._20_4_ = (uint)bVar47 * iVar76 | (uint)!bVar47 * auVar64._20_4_;
                      bVar47 = (bool)((byte)(uVar49 >> 6) & 1);
                      auVar67._24_4_ = (uint)bVar47 * iVar77 | (uint)!bVar47 * auVar64._24_4_;
                      bVar47 = SUB81(uVar49 >> 7,0);
                      auVar67._28_4_ = (uint)bVar47 * iVar78 | (uint)!bVar47 * auVar64._28_4_;
                      auVar56 = vrcp14ps_avx512vl(auVar65);
                      auVar63 = vfnmadd213ps_avx512vl(auVar65,auVar56,auVar70);
                      auVar63 = vfmadd132ps_avx512vl(auVar63,auVar56,auVar56);
                      auVar56 = vrcp14ps_avx512vl(auVar66);
                      auVar64 = vfnmadd213ps_avx512vl(auVar66,auVar56,auVar70);
                      auVar64 = vfmadd132ps_avx512vl(auVar64,auVar56,auVar56);
                      auVar56 = vrcp14ps_avx512vl(auVar67);
                      auVar68 = vfnmadd213ps_avx512vl(auVar67,auVar56,auVar70);
                      uVar42 = *(undefined4 *)(uVar50 + 0xb0 + uVar40 * 4);
                      auVar29._4_4_ = uVar42;
                      auVar29._0_4_ = uVar42;
                      auVar29._8_4_ = uVar42;
                      auVar29._12_4_ = uVar42;
                      auVar29._16_4_ = uVar42;
                      auVar29._20_4_ = uVar42;
                      auVar29._24_4_ = uVar42;
                      auVar29._28_4_ = uVar42;
                      auVar69 = vfmadd213ps_avx512vl(auVar83,auVar35,auVar29);
                      uVar42 = *(undefined4 *)(uVar50 + 0xc0 + uVar40 * 4);
                      auVar30._4_4_ = uVar42;
                      auVar30._0_4_ = uVar42;
                      auVar30._8_4_ = uVar42;
                      auVar30._12_4_ = uVar42;
                      auVar30._16_4_ = uVar42;
                      auVar30._20_4_ = uVar42;
                      auVar30._24_4_ = uVar42;
                      auVar30._28_4_ = uVar42;
                      auVar70 = vfmadd213ps_avx512vl(auVar80,auVar35,auVar30);
                      auVar68 = vfmadd132ps_avx512vl(auVar68,auVar56,auVar56);
                      uVar42 = *(undefined4 *)(uVar50 + 0xd0 + uVar40 * 4);
                      auVar31._4_4_ = uVar42;
                      auVar31._0_4_ = uVar42;
                      auVar31._8_4_ = uVar42;
                      auVar31._12_4_ = uVar42;
                      auVar31._16_4_ = uVar42;
                      auVar31._20_4_ = uVar42;
                      auVar31._24_4_ = uVar42;
                      auVar31._28_4_ = uVar42;
                      auVar56 = vfmadd213ps_avx512vl(auVar79,auVar35,auVar31);
                      auVar69 = vfmadd231ps_avx512vl(auVar69,auVar34,auVar108);
                      auVar70 = vfmadd231ps_avx512vl(auVar70,auVar34,auVar105);
                      auVar56 = vfmadd231ps_avx512vl(auVar56,auVar34,auVar103);
                      auVar69 = vfmadd231ps_avx512vl(auVar69,auVar33,auVar97);
                      auVar70 = vfmadd231ps_avx512vl(auVar70,auVar33,auVar95);
                      auVar71 = vfmadd231ps_avx512vl(auVar56,auVar33,auVar87);
                      auVar56 = vsubps_avx(auVar58,auVar69);
                      auVar58 = vmulps_avx512vl(auVar63,auVar56);
                      auVar56 = vsubps_avx(auVar55,auVar70);
                      auVar55 = vmulps_avx512vl(auVar64,auVar56);
                      auVar56 = vsubps_avx(auVar60,auVar71);
                      auVar60 = vmulps_avx512vl(auVar68,auVar56);
                      auVar56 = vsubps_avx512vl(auVar61,auVar69);
                      auVar61 = vmulps_avx512vl(auVar63,auVar56);
                      auVar56 = vsubps_avx(auVar62,auVar70);
                      auVar62 = vmulps_avx512vl(auVar64,auVar56);
                      auVar56 = vsubps_avx(auVar57,auVar71);
                      auVar63 = vmulps_avx512vl(auVar68,auVar56);
                      auVar56 = vpminsd_avx2(auVar58,auVar61);
                      auVar57 = vpminsd_avx2(auVar55,auVar62);
                      auVar56 = vpmaxsd_avx2(auVar56,auVar57);
                      auVar57 = vpminsd_avx2(auVar60,auVar63);
                      auVar57 = vpmaxsd_avx2(auVar56,auVar57);
                      auVar56 = vpmaxsd_avx2(auVar58,auVar61);
                      auVar58 = vpmaxsd_avx2(auVar55,auVar62);
                      auVar58 = vpminsd_avx2(auVar56,auVar58);
                      auVar56 = vpmaxsd_avx2(auVar60,auVar63);
                      auVar56 = vpminsd_avx2(auVar58,auVar56);
                      auVar36._4_4_ = uStack_27fc;
                      auVar36._0_4_ = local_2800;
                      auVar36._8_4_ = uStack_27f8;
                      auVar36._12_4_ = uStack_27f4;
                      auVar36._16_4_ = uStack_27f0;
                      auVar36._20_4_ = uStack_27ec;
                      auVar36._24_4_ = uStack_27e8;
                      auVar36._28_4_ = uStack_27e4;
                      auVar58 = vpmaxsd_avx2(auVar57,auVar36);
                      auVar56 = vpminsd_avx2(auVar56,local_27e0);
                      uVar49 = vcmpps_avx512vl(auVar58,auVar56,2);
                    }
                    uVar19 = vcmpps_avx512vl(local_27e0,auVar59,6);
                    uVar49 = uVar49 & uVar19;
                    if ((byte)uVar49 != 0) {
                      auVar57 = vblendmps_avx512vl(auVar114._0_32_,auVar57);
                      bVar47 = (bool)((byte)uVar49 & 1);
                      bVar4 = (bool)((byte)(uVar49 >> 1) & 1);
                      bVar5 = (bool)((byte)(uVar49 >> 2) & 1);
                      bVar6 = (bool)((byte)(uVar49 >> 3) & 1);
                      bVar7 = (bool)((byte)(uVar49 >> 4) & 1);
                      bVar8 = (bool)((byte)(uVar49 >> 5) & 1);
                      bVar9 = (bool)((byte)(uVar49 >> 6) & 1);
                      bVar10 = SUB81(uVar49 >> 7,0);
                      if (root.ptr != 8) {
                        *puVar45 = root.ptr;
                        puVar45 = puVar45 + 1;
                        *pauVar46 = auVar115._0_32_;
                        pauVar46 = pauVar46 + 1;
                      }
                      auVar115 = ZEXT3264(CONCAT428((uint)bVar10 * auVar57._28_4_ |
                                                    (uint)!bVar10 * auVar56._28_4_,
                                                    CONCAT424((uint)bVar9 * auVar57._24_4_ |
                                                              (uint)!bVar9 * auVar56._24_4_,
                                                              CONCAT420((uint)bVar8 * auVar57._20_4_
                                                                        | (uint)!bVar8 *
                                                                          auVar56._20_4_,
                                                                        CONCAT416((uint)bVar7 *
                                                                                  auVar57._16_4_ |
                                                                                  (uint)!bVar7 *
                                                                                  auVar56._16_4_,
                                                                                  CONCAT412((uint)
                                                  bVar6 * auVar57._12_4_ |
                                                  (uint)!bVar6 * auVar56._12_4_,
                                                  CONCAT48((uint)bVar5 * auVar57._8_4_ |
                                                           (uint)!bVar5 * auVar56._8_4_,
                                                           CONCAT44((uint)bVar4 * auVar57._4_4_ |
                                                                    (uint)!bVar4 * auVar56._4_4_,
                                                                    (uint)bVar47 * auVar57._0_4_ |
                                                                    (uint)!bVar47 * auVar56._0_4_)))
                                                  )))));
                      root.ptr = uVar2;
                    }
                  }
                } while ((uVar2 != 8) && (bVar47 = uVar40 < 3, uVar40 = uVar40 + 1, bVar47));
                iVar51 = 0;
                if (root.ptr == 8) {
LAB_007b2f4a:
                  bVar47 = false;
                  iVar51 = 4;
                }
                else {
                  uVar18 = vcmpps_avx512vl(auVar115._0_32_,local_27e0,9);
                  bVar47 = true;
                  if ((uint)POPCOUNT((int)uVar18) <= uVar44) {
                    *puVar45 = root.ptr;
                    puVar45 = puVar45 + 1;
                    *pauVar46 = auVar115._0_32_;
                    pauVar46 = pauVar46 + 1;
                    goto LAB_007b2f4a;
                  }
                }
              } while (bVar47);
            }
          }
        }
      } while (iVar51 != 3);
      bVar39 = bVar39 & (byte)uVar48;
      bVar47 = (bool)(bVar39 >> 1 & 1);
      bVar4 = (bool)(bVar39 >> 2 & 1);
      bVar5 = (bool)(bVar39 >> 3 & 1);
      bVar6 = (bool)(bVar39 >> 4 & 1);
      bVar7 = (bool)(bVar39 >> 5 & 1);
      bVar8 = (bool)(bVar39 >> 6 & 1);
      *(uint *)(ray + 0x100) =
           (uint)(bVar39 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar39 & 1) * *(int *)(ray + 0x100);
      *(uint *)(ray + 0x104) = (uint)bVar47 * auVar113._4_4_ | (uint)!bVar47 * *(int *)(ray + 0x104)
      ;
      *(uint *)(ray + 0x108) = (uint)bVar4 * auVar113._8_4_ | (uint)!bVar4 * *(int *)(ray + 0x108);
      *(uint *)(ray + 0x10c) = (uint)bVar5 * auVar113._12_4_ | (uint)!bVar5 * *(int *)(ray + 0x10c);
      *(uint *)(ray + 0x110) = (uint)bVar6 * auVar113._16_4_ | (uint)!bVar6 * *(int *)(ray + 0x110);
      *(uint *)(ray + 0x114) = (uint)bVar7 * auVar113._20_4_ | (uint)!bVar7 * *(int *)(ray + 0x114);
      *(uint *)(ray + 0x118) = (uint)bVar8 * auVar113._24_4_ | (uint)!bVar8 * *(int *)(ray + 0x118);
      *(uint *)(ray + 0x11c) =
           (uint)(bVar39 >> 7) * auVar113._28_4_ |
           (uint)!(bool)(bVar39 >> 7) * *(int *)(ray + 0x11c);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }